

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_shape.cxx
# Opt level: O2

void __thiscall Fl_Window::draw(Fl_Window *this)

{
  uint uVar1;
  Fl_Image *pFVar2;
  Fl_Label l1;
  Fl_Label local_48;
  
  if ((shape_data_ != (shape_data_type *)0x0) &&
     (((shape_data_->lw_ != (this->super_Fl_Group).super_Fl_Widget.w_ ||
       (shape_data_->lh_ != (this->super_Fl_Group).super_Fl_Widget.h_)) &&
      (shape_data_->shape_ != (Fl_Image *)0x0)))) {
    combine_mask(this);
  }
  if (1 < (this->super_Fl_Group).super_Fl_Widget.damage_) {
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)(this->super_Fl_Group).super_Fl_Widget.box_,0,0,
                        (this->super_Fl_Group).super_Fl_Widget.w_,
                        (this->super_Fl_Group).super_Fl_Widget.h_,
                        (this->super_Fl_Group).super_Fl_Widget.color_);
    pFVar2 = (this->super_Fl_Group).super_Fl_Widget.label_.image;
    if ((pFVar2 != (Fl_Image *)0x0) &&
       (uVar1 = (this->super_Fl_Group).super_Fl_Widget.label_.align_, (uVar1 & 0x10) != 0)) {
      local_48.type = '\0';
      local_48._41_7_ = 0;
      local_48.value = (char *)0x0;
      local_48.deimage = (Fl_Image *)0x0;
      local_48.font = 0;
      local_48.size = 0;
      local_48._32_8_ = (ulong)uVar1 << 0x20;
      local_48.image = pFVar2;
      Fl_Widget::active_r((Fl_Widget *)this);
      local_48.type = (this->super_Fl_Group).super_Fl_Widget.label_.type;
      Fl_Label::draw(&local_48,0,0,(this->super_Fl_Group).super_Fl_Widget.w_,
                     (this->super_Fl_Group).super_Fl_Widget.h_,
                     (this->super_Fl_Group).super_Fl_Widget.label_.align_);
    }
  }
  Fl_Group::draw_children(&this->super_Fl_Group);
  return;
}

Assistant:

void Fl_Window::draw() {
  if (shape_data_) {
# if defined(__APPLE__) && MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_X_VERSION_10_4
    if (shape_data_->mask && (&CGContextClipToMask != NULL)) {
      CGContextClipToMask(fl_gc, CGRectMake(0,0,w(),h()), shape_data_->mask); // requires Mac OS 10.4
    }
    CGContextSaveGState(fl_gc);
#elif defined(WIN32)
    if ((shape_data_->lw_ != w() || shape_data_->lh_ != h()) && shape_data_->shape_) {
      // size of window has changed since last time
      shape_data_->lw_ = w();
      shape_data_->lh_ = h();
      Fl_Image* temp = shape_data_->shape_->copy(shape_data_->lw_, shape_data_->lh_);
      HRGN region = bitmap2region(temp);
      SetWindowRgn(fl_xid(this), region, TRUE); // the system deletes the region when it's no longer needed
      delete temp;
    }
#elif !(defined(__APPLE__) || defined(WIN32))
    if (( shape_data_->lw_ != w() || shape_data_->lh_ != h() ) && shape_data_->shape_) {
        // size of window has changed since last time
    combine_mask();
    }
# endif
  }

  // The following is similar to Fl_Group::draw(), but ...
  //
  //  - draws the box at (0,0), i.e. with x=0 and y=0 instead of x() and y()
  //  - does NOT draw the label (text)
  //  - draws the image only if FL_ALIGN_INSIDE is set
  //
  // Note: The label (text) of top level windows is drawn in the title bar.
  //   Other windows do not draw their labels at all, unless drawn by their
  //   parent widgets or by special draw() methods (derived classes).

  if (damage() & ~FL_DAMAGE_CHILD) {	 // draw the entire thing
    draw_box(box(),0,0,w(),h(),color()); // draw box with x/y = 0

    if (image() && (align() & FL_ALIGN_INSIDE)) { // draw the image only
      Fl_Label l1;
      memset(&l1,0,sizeof(l1));
      l1.align_ = align();
      l1.image = image();
      if (!active_r() && l1.image && l1.deimage) l1.image = l1.deimage;
      l1.type = labeltype();
      l1.draw(0,0,w(),h(),align());
    }
  }
  draw_children();

#ifdef __APPLE_QUARTZ__
  // on OS X, windows have no frame. Before OS X 10.7, to resize a window, we drag the lower right
  // corner. This code draws a little ribbed triangle for dragging.
  if (fl_mac_os_version < 100700 && fl_gc && !parent() && resizable() &&
      (!size_range_set || minh!=maxh || minw!=maxw)) {
    int dx = Fl::box_dw(box())-Fl::box_dx(box());
    int dy = Fl::box_dh(box())-Fl::box_dy(box());
    if (dx<=0) dx = 1;
    if (dy<=0) dy = 1;
    int x1 = w()-dx-1, x2 = x1, y1 = h()-dx-1, y2 = y1;
    Fl_Color c[4] = {
      color(),
      fl_color_average(color(), FL_WHITE, 0.7f),
      fl_color_average(color(), FL_BLACK, 0.6f),
      fl_color_average(color(), FL_BLACK, 0.8f),
    };
    int i;
    for (i=dx; i<12; i++) {
      fl_color(c[i&3]);
      fl_line(x1--, y1, x2, y2--);
    }
  }
#endif
# if defined(__APPLE__) && MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_X_VERSION_10_4
  if (shape_data_) CGContextRestoreGState(fl_gc);
# endif
  
# if defined(FLTK_USE_CAIRO)
  Fl::cairo_make_current(this); // checkout if an update is necessary
# endif
}